

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

TIntermAggregate * __thiscall glslang::TIntermediate::findLinkerObjects(TIntermediate *this)

{
  int iVar1;
  TOperator TVar2;
  undefined4 extraout_var;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  reference ppTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermSequence *globals;
  TIntermediate *this_local;
  
  iVar1 = (*this->treeRoot->_vptr_TIntermNode[6])();
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 400))();
  ppTVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::back(this_00);
  iVar1 = (*(*ppTVar3)->_vptr_TIntermNode[6])();
  TVar2 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_00,iVar1));
  if (TVar2 == EOpLinkerObjects) {
    ppTVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::back(this_00);
    iVar1 = (*(*ppTVar3)->_vptr_TIntermNode[6])();
    return (TIntermAggregate *)CONCAT44(extraout_var_01,iVar1);
  }
  __assert_fail("globals.back()->getAsAggregate()->getOp() == EOpLinkerObjects",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                ,0x6a2,"TIntermAggregate *glslang::TIntermediate::findLinkerObjects() const");
}

Assistant:

TIntermAggregate* TIntermediate::findLinkerObjects() const
{
    // Get the top-level globals
    TIntermSequence& globals = treeRoot->getAsAggregate()->getSequence();

    // Get the last member of the sequences, expected to be the linker-object lists
    assert(globals.back()->getAsAggregate()->getOp() == EOpLinkerObjects);

    return globals.back()->getAsAggregate();
}